

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hxx
# Opt level: O1

void __thiscall nuraft::context::~context(context *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  p_Var1 = (this->cb_func_).func.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->cb_func_,(_Any_data *)&this->cb_func_,__destroy_functor);
  }
  p_Var2 = (this->params_).super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->rpc_cli_factory_).
           super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->rpc_listener_).
           super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->state_mgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

context( ptr<state_mgr>& mgr,
             ptr<state_machine>& m,
             ptr<rpc_listener>& listener,
             ptr<logger>& l,
             ptr<rpc_client_factory>& cli_factory,
             ptr<delayed_task_scheduler>& scheduler,
             const raft_params& params )
        : state_mgr_(mgr)
        , state_machine_(m)
        , rpc_listener_(listener)
        , logger_(l)
        , rpc_cli_factory_(cli_factory)
        , scheduler_(scheduler)
        , params_( cs_new<raft_params>(params) )
        {}